

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

Bool tidyInitSink(TidyOutputSink *sink,void *snkData,TidyPutByteFunc pbFunc)

{
  bool local_25;
  Bool status;
  TidyPutByteFunc pbFunc_local;
  void *snkData_local;
  TidyOutputSink *sink_local;
  
  local_25 = false;
  if ((sink != (TidyOutputSink *)0x0) && (local_25 = false, snkData != (void *)0x0)) {
    local_25 = pbFunc != (TidyPutByteFunc)0x0;
  }
  if (local_25 != no) {
    sink->sinkData = snkData;
    sink->putByte = pbFunc;
  }
  return (uint)local_25;
}

Assistant:

Bool TIDY_CALL tidyInitSink( TidyOutputSink* sink,
                             void*           snkData,
                             TidyPutByteFunc pbFunc )
{
  Bool status = ( sink && snkData && pbFunc );
  if ( status )
  {
    sink->sinkData = snkData;
    sink->putByte  = pbFunc;
  }
  return status;
}